

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__on_seek_memory_write(void *pUserData,int offset,drwav_seek_origin origin)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  drwav *pWav;
  uint local_c;
  
  if (in_RDI == 0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xd0d,"drwav_bool32 drwav__on_seek_memory_write(void *, int, drwav_seek_origin)")
    ;
  }
  if (in_EDX == 1) {
    local_c = in_ESI;
    if ((int)in_ESI < 1) {
      if (*(ulong *)(in_RDI + 0x118) < (ulong)(long)(int)-in_ESI) {
        local_c = -(int)*(undefined8 *)(in_RDI + 0x118);
      }
    }
    else if (*(ulong *)(in_RDI + 0x108) < (ulong)(*(long *)(in_RDI + 0x118) + (long)(int)in_ESI)) {
      local_c = (int)*(undefined8 *)(in_RDI + 0x108) - (int)*(undefined8 *)(in_RDI + 0x118);
    }
    *(long *)(in_RDI + 0x118) = (long)(int)local_c + *(long *)(in_RDI + 0x118);
  }
  else if (*(ulong *)(in_RDI + 0x108) < (ulong)in_ESI) {
    *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(in_RDI + 0x108);
  }
  else {
    *(long *)(in_RDI + 0x118) = (long)(int)in_ESI;
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory_write(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStreamWrite.currentWritePos + offset > pWav->memoryStreamWrite.dataSize) {
                offset = (int)(pWav->memoryStreamWrite.dataSize - pWav->memoryStreamWrite.currentWritePos);  /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStreamWrite.currentWritePos < (size_t)-offset) {
                offset = -(int)pWav->memoryStreamWrite.currentWritePos;  /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStreamWrite.currentWritePos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStreamWrite.dataSize) {
            pWav->memoryStreamWrite.currentWritePos = offset;
        } else {
            pWav->memoryStreamWrite.currentWritePos = pWav->memoryStreamWrite.dataSize;  /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}